

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module_info.cpp
# Opt level: O2

int module_load(Server *server)

{
  istream aiStack_218 [520];
  
  puts("Loading module info...");
  std::ifstream::ifstream(aiStack_218);
  std::ifstream::open((char *)aiStack_218,0x14d000);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            (aiStack_218,(string *)&version_abi_cxx11_);
  std::ifstream::~ifstream(aiStack_218);
  refresh_mem_info();
  refresh_disk_info();
  refresh_thread_info();
  Server::append_to_hook<void(*)(Server*)>
            ((vector<void_(*)(Server_*),_std::allocator<void_(*)(Server_*)>_> *)(server + 0x18),
             timer_handler);
  Server::insert_to_front_of_hook<HTTPResponse*(*)(Client*)>
            ((vector<HTTPResponse_*(*)(Client_*),_std::allocator<HTTPResponse_*(*)(Client_*)>_> *)
             server,http_request_handler);
  puts("Loaded module info");
  return 0;
}

Assistant:

int module_load(Server *server) {
    printf("Loading module info...\n");
    get_version_info();
    refresh_mem_info();
    refresh_disk_info();
    refresh_thread_info();
    Server::append_to_hook(server->timer_hook, &timer_handler);
    Server::insert_to_front_of_hook(server->http_request_hook, &http_request_handler);
    printf("Loaded module info\n");
    return 0;
}